

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindows(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  value_type *ppIVar2;
  int local_1c;
  int i;
  char *label_local;
  ImVector<ImGuiWindow_*> *windows_local;
  
  bVar1 = TreeNode(label,"%s (%d)",label,(ulong)(uint)windows->Size);
  if (bVar1) {
    for (local_1c = 0; local_1c < windows->Size; local_1c = local_1c + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](windows,local_1c);
      NodeWindow(*ppIVar2,"Window");
    }
    TreePop();
  }
  return;
}

Assistant:

static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
            {
                if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                    return;
                for (int i = 0; i < windows.Size; i++)
                    Funcs::NodeWindow(windows[i], "Window");
                ImGui::TreePop();
            }